

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirQuantileState<int>::Resize(ReservoirQuantileState<int> *this,idx_t new_len)

{
  int *__ptr;
  int *piVar1;
  InternalException *this_00;
  allocator local_41;
  string local_40 [32];
  
  if (this->len < new_len) {
    __ptr = this->v;
    piVar1 = (int *)realloc(__ptr,new_len * 4);
    this->v = piVar1;
    if (piVar1 == (int *)0x0) {
      free(__ptr);
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string(local_40,"Memory allocation failure",&local_41);
      duckdb::InternalException::InternalException(this_00,local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    this->len = new_len;
  }
  return;
}

Assistant:

void Resize(idx_t new_len) {
		if (new_len <= len) {
			return;
		}
		T *old_v = v;
		v = (T *)realloc(v, new_len * sizeof(T));
		if (!v) {
			free(old_v);
			throw InternalException("Memory allocation failure");
		}
		len = new_len;
	}